

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse2::BVHNIntersector1<4,_16781328,_true,_embree::sse2::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 (*pauVar20) [16];
  uint uVar21;
  ulong uVar22;
  AABBNodeMB4D *node1;
  ulong uVar23;
  RayQueryContext *extraout_RDX;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  vfloat4 a0;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar67;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  float fVar73;
  float fVar75;
  float fVar76;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar78;
  undefined1 auVar69 [16];
  float fVar74;
  float fVar77;
  float fVar79;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar80;
  float fVar81;
  undefined1 auVar82 [12];
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar89;
  float fVar90;
  float fVar92;
  vfloat4 a;
  float fVar93;
  undefined1 auVar91 [16];
  float fVar94;
  float fVar95;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar97 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10e8 [8];
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  RayHit *local_1080;
  Intersectors *local_1078;
  RayQueryContext *local_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar96 [16];
  
  local_1070 = context;
  local_1078 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_1018 = aVar6.x;
    local_1028 = aVar6.y;
    local_1008 = aVar6.z;
    aVar78 = aVar6.field_3;
    fVar31 = local_1028 * local_1028;
    fVar32 = local_1008 * local_1008;
    fVar33 = aVar78.w * aVar78.w;
    fVar48 = fVar31 + local_1018 * local_1018 + fVar32;
    auVar57._0_8_ = CONCAT44(fVar31 + fVar31 + fVar33,fVar48);
    auVar57._8_4_ = fVar31 + fVar32 + fVar32;
    auVar57._12_4_ = fVar31 + fVar33 + fVar33;
    auVar59._8_4_ = auVar57._8_4_;
    auVar59._0_8_ = auVar57._0_8_;
    auVar59._12_4_ = auVar57._12_4_;
    auVar57 = rsqrtss(auVar59,auVar57);
    fVar31 = auVar57._0_4_;
    local_fb8[0] = fVar31 * 1.5 - fVar31 * fVar31 * fVar48 * 0.5 * fVar31;
    fVar31 = local_1018 * local_fb8[0];
    fVar32 = local_1028 * local_fb8[0];
    fVar33 = local_1008 * local_fb8[0];
    fVar89 = -fVar32;
    fVar48 = -fVar33;
    auVar82._8_4_ = 0xffffffff;
    auVar82._0_8_ = 0xffffffffffffffff;
    if (fVar89 * fVar89 + fVar33 * fVar33 + 0.0 <= fVar31 * fVar31 + fVar48 * fVar48 + 0.0) {
      auVar82 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar73 = (float)((uint)fVar33 & auVar82._4_4_);
    fVar48 = (float)(~auVar82._0_4_ & (uint)fVar48);
    fVar76 = (float)(~auVar82._8_4_ & (uint)fVar31 | (uint)fVar89 & auVar82._8_4_);
    fVar89 = fVar73 * fVar73;
    fVar75 = fVar76 * fVar76;
    fVar90 = fVar89 + fVar48 * fVar48 + fVar75;
    auVar72._0_8_ = CONCAT44(fVar89 + fVar89 + 0.0,fVar90);
    auVar72._8_4_ = fVar89 + fVar75 + fVar75;
    auVar72._12_4_ = fVar89 + 0.0 + 0.0;
    auVar85._8_4_ = auVar72._8_4_;
    auVar85._0_8_ = auVar72._0_8_;
    auVar85._12_4_ = auVar72._12_4_;
    auVar57 = rsqrtss(auVar85,auVar72);
    fVar89 = auVar57._0_4_;
    fVar89 = fVar89 * 1.5 - fVar89 * fVar89 * fVar90 * 0.5 * fVar89;
    fVar48 = fVar89 * fVar48;
    fVar73 = fVar89 * fVar73;
    fVar76 = fVar89 * fVar76;
    fVar75 = fVar73 * fVar31 - fVar32 * fVar48;
    fVar90 = fVar76 * fVar32 - fVar33 * fVar73;
    fVar86 = fVar48 * fVar33 - fVar31 * fVar76;
    fVar88 = fVar89 * 0.0 * aVar78.w * local_fb8[0] - aVar78.w * local_fb8[0] * fVar89 * 0.0;
    fVar89 = fVar90 * fVar90;
    fVar87 = fVar86 * fVar86;
    fVar88 = fVar88 * fVar88;
    fVar94 = fVar87 + fVar89 + fVar75 * fVar75;
    auVar96._0_8_ = CONCAT44(fVar88 + fVar89 + fVar89,fVar94);
    auVar96._8_4_ = fVar87 + fVar89 + fVar87;
    auVar96._12_4_ = fVar88 + fVar89 + fVar88;
    auVar66._8_4_ = auVar96._8_4_;
    auVar66._0_8_ = auVar96._0_8_;
    auVar66._12_4_ = auVar96._12_4_;
    auVar57 = rsqrtss(auVar66,auVar96);
    fVar89 = auVar57._0_4_;
    fVar89 = fVar89 * 1.5 - fVar89 * fVar89 * fVar94 * 0.5 * fVar89;
    local_f88._4_4_ = fVar89 * fVar75;
    local_f88._0_4_ = fVar76;
    local_f88._8_4_ = local_fb8[0] * fVar33;
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar89 * fVar86;
    local_f98._0_4_ = fVar73;
    local_f98._8_4_ = local_fb8[0] * fVar32;
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar89 * fVar90;
    local_fa8._0_4_ = fVar48;
    local_fa8._8_4_ = local_fb8[0] * fVar31;
    local_fa8._12_4_ = 0;
    pauVar24 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar31 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar32 = (ray->super_RayK<1>).org.field_0.m128[1];
    local_10c8 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar33 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    local_1038 = 0.0;
    if (0.0 <= fVar33) {
      local_1038 = fVar33;
    }
    fVar33 = (ray->super_RayK<1>).tfar;
    fVar48 = 0.0;
    if (0.0 <= fVar33) {
      fVar48 = fVar33;
    }
    auVar57 = divps(_DAT_01f46a60,(undefined1  [16])aVar6);
    local_10b8 = (float)(~-(uint)(1e-18 <= ABS(local_1018)) & 0x5d5e0b6b |
                        auVar57._0_4_ & -(uint)(1e-18 <= ABS(local_1018)));
    local_10d8 = (float)(~-(uint)(1e-18 <= ABS(local_1028)) & 0x5d5e0b6b |
                        auVar57._4_4_ & -(uint)(1e-18 <= ABS(local_1028)));
    local_1048 = (float)(~-(uint)(1e-18 <= ABS(local_1008)) & 0x5d5e0b6b |
                        auVar57._8_4_ & -(uint)(1e-18 <= ABS(local_1008)));
    local_1068 = local_10b8 * 0.99999964;
    local_10a8 = local_10d8 * 0.99999964;
    local_1058 = local_1048 * 0.99999964;
    local_10b8 = local_10b8 * 1.0000004;
    local_10d8 = local_10d8 * 1.0000004;
    local_1048 = local_1048 * 1.0000004;
    fStack_1014 = local_1018;
    fStack_1010 = local_1018;
    fStack_100c = local_1018;
    fStack_1024 = local_1028;
    fStack_1020 = local_1028;
    fStack_101c = local_1028;
    fStack_1004 = local_1008;
    fStack_1000 = local_1008;
    fStack_ffc = local_1008;
    uVar27 = (ulong)(local_1068 < 0.0) * 0x10;
    uVar26 = (ulong)(local_10a8 < 0.0) << 4 | 0x20;
    uVar25 = (ulong)(local_1058 < 0.0) << 4 | 0x40;
    fStack_10c4 = local_10c8;
    fStack_10c0 = local_10c8;
    fStack_10bc = local_10c8;
    fStack_1034 = local_1038;
    fStack_1030 = local_1038;
    fStack_102c = local_1038;
    fStack_1044 = local_1048;
    fStack_1040 = local_1048;
    fStack_103c = local_1048;
    fStack_1054 = local_1058;
    fStack_1050 = local_1058;
    fStack_104c = local_1058;
    fStack_1064 = local_1068;
    fStack_1060 = local_1068;
    fStack_105c = local_1068;
    fStack_10a4 = local_10a8;
    fStack_10a0 = local_10a8;
    fStack_109c = local_10a8;
    fStack_10b4 = local_10b8;
    fStack_10b0 = local_10b8;
    fStack_10ac = local_10b8;
    fStack_10d4 = local_10d8;
    fStack_10d0 = local_10d8;
    fStack_10cc = local_10d8;
    local_1080 = ray;
    fVar33 = fVar48;
    fVar89 = fVar48;
    fVar73 = fVar48;
    fVar75 = local_1068;
    fVar76 = local_1068;
    fVar90 = local_1068;
    fVar86 = local_1068;
    fVar87 = local_1038;
    fVar88 = local_1038;
    fVar94 = local_1038;
    fVar67 = local_1038;
    fVar68 = local_10c8;
    fVar74 = local_10c8;
    fVar77 = local_10c8;
    fVar79 = local_10c8;
    fVar80 = local_1058;
    fVar81 = local_1058;
    fVar101 = local_1058;
    fVar102 = local_1058;
    fVar103 = local_10d8;
    fVar104 = local_10d8;
    fVar105 = local_10d8;
    fVar106 = local_10d8;
    fVar107 = local_10a8;
    fVar108 = local_10a8;
    fVar109 = local_10a8;
    fVar110 = local_10a8;
    fVar111 = local_10b8;
    fVar112 = local_10b8;
    fVar92 = local_10b8;
    fVar93 = local_10b8;
    fVar95 = local_1048;
    fVar98 = local_1048;
    fVar99 = local_1048;
    fVar100 = local_1048;
LAB_00569a81:
    if (pauVar24 != (undefined1 (*) [16])&local_f78) {
      pauVar20 = pauVar24 + -1;
      pauVar24 = pauVar24 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar20 + 8) < *pfVar1 || *(float *)((long)*pauVar20 + 8) == *pfVar1) {
        uVar22 = *(ulong *)*pauVar24;
        while ((uVar22 & 8) == 0) {
          fVar5 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar21 = (uint)uVar22 & 7;
          uVar23 = uVar22 & 0xfffffffffffffff0;
          if (uVar21 == 3) {
            local_fd8 = *(float *)(uVar23 + 0x70);
            fStack_fd4 = *(float *)(uVar23 + 0x74);
            fStack_fd0 = *(float *)(uVar23 + 0x78);
            fStack_fcc = *(float *)(uVar23 + 0x7c);
            local_ff8 = *(float *)(uVar23 + 0x80);
            fStack_ff4 = *(float *)(uVar23 + 0x84);
            fStack_ff0 = *(float *)(uVar23 + 0x88);
            fStack_fec = *(float *)(uVar23 + 0x8c);
            local_fe8 = *(float *)(uVar23 + 0x90);
            fStack_fe4 = *(float *)(uVar23 + 0x94);
            fStack_fe0 = *(float *)(uVar23 + 0x98);
            fStack_fdc = *(float *)(uVar23 + 0x9c);
            local_fc8 = *(float *)(uVar23 + 0xa0);
            fStack_fc4 = *(float *)(uVar23 + 0xa4);
            fStack_fc0 = *(float *)(uVar23 + 0xa8);
            fStack_fbc = *(float *)(uVar23 + 0xac);
            fVar80 = 1.0 - fVar5;
            fVar81 = fVar80 * 0.0;
            fVar75 = local_1018 * *(float *)(uVar23 + 0x20) +
                     local_1028 * *(float *)(uVar23 + 0x50) + local_1008 * local_ff8;
            fVar76 = fStack_1014 * *(float *)(uVar23 + 0x24) +
                     fStack_1024 * *(float *)(uVar23 + 0x54) + fStack_1004 * fStack_ff4;
            fVar90 = fStack_1010 * *(float *)(uVar23 + 0x28) +
                     fStack_1020 * *(float *)(uVar23 + 0x58) + fStack_1000 * fStack_ff0;
            fVar86 = fStack_100c * *(float *)(uVar23 + 0x2c) +
                     fStack_101c * *(float *)(uVar23 + 0x5c) + fStack_ffc * fStack_fec;
            fVar87 = local_1018 * *(float *)(uVar23 + 0x30) +
                     local_1028 * *(float *)(uVar23 + 0x60) + local_1008 * local_fe8;
            fVar88 = fStack_1014 * *(float *)(uVar23 + 0x34) +
                     fStack_1024 * *(float *)(uVar23 + 100) + fStack_1004 * fStack_fe4;
            fVar94 = fStack_1010 * *(float *)(uVar23 + 0x38) +
                     fStack_1020 * *(float *)(uVar23 + 0x68) + fStack_1000 * fStack_fe0;
            fVar67 = fStack_100c * *(float *)(uVar23 + 0x3c) +
                     fStack_101c * *(float *)(uVar23 + 0x6c) + fStack_ffc * fStack_fdc;
            fVar68 = local_1018 * *(float *)(uVar23 + 0x40) +
                     local_1028 * local_fd8 + local_1008 * local_fc8;
            fVar74 = fStack_1014 * *(float *)(uVar23 + 0x44) +
                     fStack_1024 * fStack_fd4 + fStack_1004 * fStack_fc4;
            fVar77 = fStack_1010 * *(float *)(uVar23 + 0x48) +
                     fStack_1020 * fStack_fd0 + fStack_1000 * fStack_fc0;
            fVar79 = fStack_100c * *(float *)(uVar23 + 0x4c) +
                     fStack_101c * fStack_fcc + fStack_ffc * fStack_fbc;
            uVar21 = -(uint)(1e-18 <= ABS(fVar75));
            uVar28 = -(uint)(1e-18 <= ABS(fVar76));
            uVar29 = -(uint)(1e-18 <= ABS(fVar90));
            uVar30 = -(uint)(1e-18 <= ABS(fVar86));
            auVar42._0_4_ = (uint)fVar75 & uVar21;
            auVar42._4_4_ = (uint)fVar76 & uVar28;
            auVar42._8_4_ = (uint)fVar90 & uVar29;
            auVar42._12_4_ = (uint)fVar86 & uVar30;
            auVar52._0_8_ = CONCAT44(~uVar28,~uVar21) & 0x219392ef219392ef;
            auVar52._8_4_ = ~uVar29 & 0x219392ef;
            auVar52._12_4_ = ~uVar30 & 0x219392ef;
            auVar52 = auVar52 | auVar42;
            uVar21 = -(uint)(1e-18 <= ABS(fVar87));
            uVar28 = -(uint)(1e-18 <= ABS(fVar88));
            uVar29 = -(uint)(1e-18 <= ABS(fVar94));
            uVar30 = -(uint)(1e-18 <= ABS(fVar67));
            auVar61._0_4_ = (uint)fVar87 & uVar21;
            auVar61._4_4_ = (uint)fVar88 & uVar28;
            auVar61._8_4_ = (uint)fVar94 & uVar29;
            auVar61._12_4_ = (uint)fVar67 & uVar30;
            auVar43._0_8_ = CONCAT44(~uVar28,~uVar21) & 0x219392ef219392ef;
            auVar43._8_4_ = ~uVar29 & 0x219392ef;
            auVar43._12_4_ = ~uVar30 & 0x219392ef;
            auVar43 = auVar43 | auVar61;
            uVar21 = -(uint)(1e-18 <= ABS(fVar68));
            uVar28 = -(uint)(1e-18 <= ABS(fVar74));
            uVar29 = -(uint)(1e-18 <= ABS(fVar77));
            uVar30 = -(uint)(1e-18 <= ABS(fVar79));
            auVar70._0_4_ = (uint)fVar68 & uVar21;
            auVar70._4_4_ = (uint)fVar74 & uVar28;
            auVar70._8_4_ = (uint)fVar77 & uVar29;
            auVar70._12_4_ = (uint)fVar79 & uVar30;
            auVar62._0_8_ = CONCAT44(~uVar28,~uVar21) & 0x219392ef219392ef;
            auVar62._8_4_ = ~uVar29 & 0x219392ef;
            auVar62._12_4_ = ~uVar30 & 0x219392ef;
            auVar62 = auVar62 | auVar70;
            auVar57 = rcpps(auVar70,auVar52);
            fVar68 = auVar57._0_4_;
            fVar74 = auVar57._4_4_;
            fVar77 = auVar57._8_4_;
            fVar79 = auVar57._12_4_;
            fVar68 = (1.0 - auVar52._0_4_ * fVar68) * fVar68 + fVar68;
            fVar74 = (1.0 - auVar52._4_4_ * fVar74) * fVar74 + fVar74;
            fVar77 = (1.0 - auVar52._8_4_ * fVar77) * fVar77 + fVar77;
            fVar79 = (1.0 - auVar52._12_4_ * fVar79) * fVar79 + fVar79;
            auVar57 = rcpps(auVar57,auVar43);
            fVar87 = auVar57._0_4_;
            fVar88 = auVar57._4_4_;
            fVar94 = auVar57._8_4_;
            fVar67 = auVar57._12_4_;
            fVar87 = (1.0 - auVar43._0_4_ * fVar87) * fVar87 + fVar87;
            fVar88 = (1.0 - auVar43._4_4_ * fVar88) * fVar88 + fVar88;
            fVar94 = (1.0 - auVar43._8_4_ * fVar94) * fVar94 + fVar94;
            fVar67 = (1.0 - auVar43._12_4_ * fVar67) * fVar67 + fVar67;
            auVar57 = rcpps(auVar57,auVar62);
            fVar75 = auVar57._0_4_;
            fVar76 = auVar57._4_4_;
            fVar90 = auVar57._8_4_;
            fVar86 = auVar57._12_4_;
            fVar75 = (1.0 - auVar62._0_4_ * fVar75) * fVar75 + fVar75;
            fVar76 = (1.0 - auVar62._4_4_ * fVar76) * fVar76 + fVar76;
            fVar90 = (1.0 - auVar62._8_4_ * fVar90) * fVar90 + fVar90;
            fVar86 = (1.0 - auVar62._12_4_ * fVar86) * fVar86 + fVar86;
            local_1098 = *(float *)(uVar23 + 0x50) * fVar32 +
                         local_ff8 * local_10c8 + *(float *)(uVar23 + 0xb0);
            fStack_1094 = *(float *)(uVar23 + 0x54) * fVar32 +
                          fStack_ff4 * fStack_10c4 + *(float *)(uVar23 + 0xb4);
            fStack_1090 = *(float *)(uVar23 + 0x58) * fVar32 +
                          fStack_ff0 * fStack_10c0 + *(float *)(uVar23 + 0xb8);
            fStack_108c = *(float *)(uVar23 + 0x5c) * fVar32 +
                          fStack_fec * fStack_10bc + *(float *)(uVar23 + 0xbc);
            fVar101 = *(float *)(uVar23 + 0x20) * fVar31 + local_1098;
            fVar102 = *(float *)(uVar23 + 0x24) * fVar31 + fStack_1094;
            fVar103 = *(float *)(uVar23 + 0x28) * fVar31 + fStack_1090;
            fVar104 = *(float *)(uVar23 + 0x2c) * fVar31 + fStack_108c;
            fVar105 = *(float *)(uVar23 + 0x30) * fVar31 +
                      *(float *)(uVar23 + 0x60) * fVar32 +
                      local_fe8 * local_10c8 + *(float *)(uVar23 + 0xc0);
            fVar106 = *(float *)(uVar23 + 0x34) * fVar31 +
                      *(float *)(uVar23 + 100) * fVar32 +
                      fStack_fe4 * fStack_10c4 + *(float *)(uVar23 + 0xc4);
            fVar107 = *(float *)(uVar23 + 0x38) * fVar31 +
                      *(float *)(uVar23 + 0x68) * fVar32 +
                      fStack_fe0 * fStack_10c0 + *(float *)(uVar23 + 200);
            fVar108 = *(float *)(uVar23 + 0x3c) * fVar31 +
                      *(float *)(uVar23 + 0x6c) * fVar32 +
                      fStack_fdc * fStack_10bc + *(float *)(uVar23 + 0xcc);
            fVar109 = *(float *)(uVar23 + 0x40) * fVar31 +
                      local_fd8 * fVar32 + local_fc8 * local_10c8 + *(float *)(uVar23 + 0xd0);
            fVar110 = *(float *)(uVar23 + 0x44) * fVar31 +
                      fStack_fd4 * fVar32 + fStack_fc4 * fStack_10c4 + *(float *)(uVar23 + 0xd4);
            fVar111 = *(float *)(uVar23 + 0x48) * fVar31 +
                      fStack_fd0 * fVar32 + fStack_fc0 * fStack_10c0 + *(float *)(uVar23 + 0xd8);
            fVar112 = *(float *)(uVar23 + 0x4c) * fVar31 +
                      fStack_fcc * fVar32 + fStack_fbc * fStack_10bc + *(float *)(uVar23 + 0xdc);
            auVar97._0_8_ =
                 CONCAT44(((*(float *)(uVar23 + 0xe4) * fVar5 + fVar81) - fVar102) * fVar74,
                          ((*(float *)(uVar23 + 0xe0) * fVar5 + fVar81) - fVar101) * fVar68);
            auVar97._8_4_ = ((*(float *)(uVar23 + 0xe8) * fVar5 + fVar81) - fVar103) * fVar77;
            auVar97._12_4_ = ((*(float *)(uVar23 + 0xec) * fVar5 + fVar81) - fVar104) * fVar79;
            fVar68 = ((*(float *)(uVar23 + 0x110) * fVar5 + fVar80) - fVar101) * fVar68;
            fVar74 = ((*(float *)(uVar23 + 0x114) * fVar5 + fVar80) - fVar102) * fVar74;
            fVar77 = ((*(float *)(uVar23 + 0x118) * fVar5 + fVar80) - fVar103) * fVar77;
            fVar79 = ((*(float *)(uVar23 + 0x11c) * fVar5 + fVar80) - fVar104) * fVar79;
            auVar91._0_8_ =
                 CONCAT44(((*(float *)(uVar23 + 0xf4) * fVar5 + fVar81) - fVar106) * fVar88,
                          ((*(float *)(uVar23 + 0xf0) * fVar5 + fVar81) - fVar105) * fVar87);
            auVar91._8_4_ = ((*(float *)(uVar23 + 0xf8) * fVar5 + fVar81) - fVar107) * fVar94;
            auVar91._12_4_ = ((*(float *)(uVar23 + 0xfc) * fVar5 + fVar81) - fVar108) * fVar67;
            auVar83._0_8_ =
                 CONCAT44(((fVar81 + *(float *)(uVar23 + 0x104) * fVar5) - fVar110) * fVar76,
                          ((fVar81 + *(float *)(uVar23 + 0x100) * fVar5) - fVar109) * fVar75);
            auVar83._8_4_ = ((fVar81 + *(float *)(uVar23 + 0x108) * fVar5) - fVar111) * fVar90;
            auVar83._12_4_ = ((fVar81 + *(float *)(uVar23 + 0x10c) * fVar5) - fVar112) * fVar86;
            fVar87 = ((*(float *)(uVar23 + 0x120) * fVar5 + fVar80) - fVar105) * fVar87;
            fVar88 = ((*(float *)(uVar23 + 0x124) * fVar5 + fVar80) - fVar106) * fVar88;
            fVar94 = ((*(float *)(uVar23 + 0x128) * fVar5 + fVar80) - fVar107) * fVar94;
            fVar67 = ((*(float *)(uVar23 + 300) * fVar5 + fVar80) - fVar108) * fVar67;
            auVar35._0_4_ = ((fVar5 * *(float *)(uVar23 + 0x130) + fVar80) - fVar109) * fVar75;
            auVar35._4_4_ = ((fVar5 * *(float *)(uVar23 + 0x134) + fVar80) - fVar110) * fVar76;
            auVar35._8_4_ = ((fVar5 * *(float *)(uVar23 + 0x138) + fVar80) - fVar111) * fVar90;
            auVar35._12_4_ = ((fVar5 * *(float *)(uVar23 + 0x13c) + fVar80) - fVar112) * fVar86;
            auVar44._8_4_ = auVar91._8_4_;
            auVar44._0_8_ = auVar91._0_8_;
            auVar44._12_4_ = auVar91._12_4_;
            auVar15._4_4_ = fVar88;
            auVar15._0_4_ = fVar87;
            auVar15._8_4_ = fVar94;
            auVar15._12_4_ = fVar67;
            auVar57 = minps(auVar44,auVar15);
            auVar53._8_4_ = auVar83._8_4_;
            auVar53._0_8_ = auVar83._0_8_;
            auVar53._12_4_ = auVar83._12_4_;
            auVar59 = minps(auVar53,auVar35);
            auVar59 = maxps(auVar57,auVar59);
            auVar54._8_4_ = auVar97._8_4_;
            auVar54._0_8_ = auVar97._0_8_;
            auVar54._12_4_ = auVar97._12_4_;
            auVar17._4_4_ = fVar74;
            auVar17._0_4_ = fVar68;
            auVar17._8_4_ = fVar77;
            auVar17._12_4_ = fVar79;
            auVar57 = minps(auVar54,auVar17);
            auVar18._4_4_ = fVar74;
            auVar18._0_4_ = fVar68;
            auVar18._8_4_ = fVar77;
            auVar18._12_4_ = fVar79;
            auVar85 = maxps(auVar97,auVar18);
            auVar19._4_4_ = fStack_1034;
            auVar19._0_4_ = local_1038;
            auVar19._8_4_ = fStack_1030;
            auVar19._12_4_ = fStack_102c;
            auVar16._4_4_ = fVar88;
            auVar16._0_4_ = fVar87;
            auVar16._8_4_ = fVar94;
            auVar16._12_4_ = fVar67;
            auVar72 = maxps(auVar91,auVar16);
            auVar66 = maxps(auVar83,auVar35);
            auVar66 = minps(auVar72,auVar66);
            auVar57 = maxps(auVar19,auVar57);
            auVar57 = maxps(auVar57,auVar59);
            auVar45._4_4_ = fVar33;
            auVar45._0_4_ = fVar48;
            auVar45._8_4_ = fVar89;
            auVar45._12_4_ = fVar73;
            auVar59 = minps(auVar45,auVar85);
            auVar59 = minps(auVar59,auVar66);
            local_10e8._0_4_ = auVar57._0_4_ * 0.99999964;
            local_10e8._4_4_ = auVar57._4_4_ * 0.99999964;
            fStack_10e0 = auVar57._8_4_ * 0.99999964;
            fStack_10dc = auVar57._12_4_ * 0.99999964;
            auVar36._4_4_ = -(uint)((float)local_10e8._4_4_ <= auVar59._4_4_ * 1.0000004);
            auVar36._0_4_ = -(uint)((float)local_10e8._0_4_ <= auVar59._0_4_ * 1.0000004);
            auVar36._8_4_ = -(uint)(fStack_10e0 <= auVar59._8_4_ * 1.0000004);
            auVar36._12_4_ = -(uint)(fStack_10dc <= auVar59._12_4_ * 1.0000004);
            uVar21 = movmskps((int)context,auVar36);
            fVar75 = local_1068;
            fVar76 = fStack_1064;
            fVar90 = fStack_1060;
            fVar86 = fStack_105c;
            fVar87 = local_1038;
            fVar88 = fStack_1034;
            fVar94 = fStack_1030;
            fVar67 = fStack_102c;
            fVar68 = local_10c8;
            fVar74 = fStack_10c4;
            fVar77 = fStack_10c0;
            fVar79 = fStack_10bc;
            fVar80 = local_1058;
            fVar81 = fStack_1054;
            fVar101 = fStack_1050;
            fVar102 = fStack_104c;
            fVar103 = local_10d8;
            fVar104 = fStack_10d4;
            fVar105 = fStack_10d0;
            fVar106 = fStack_10cc;
            fVar107 = local_10a8;
            fVar108 = fStack_10a4;
            fVar109 = fStack_10a0;
            fVar110 = fStack_109c;
            fVar111 = local_10b8;
            fVar112 = fStack_10b4;
            fVar92 = fStack_10b0;
            fVar93 = fStack_10ac;
            fVar95 = local_1048;
            fVar98 = fStack_1044;
            fVar99 = fStack_1040;
            fVar100 = fStack_103c;
          }
          else {
            pfVar3 = (float *)(uVar23 + 0x80 + uVar27);
            pfVar1 = (float *)(uVar23 + 0x20 + uVar27);
            pfVar4 = (float *)(uVar23 + 0x80 + uVar26);
            pfVar2 = (float *)(uVar23 + 0x20 + uVar26);
            auVar49._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar31) * fVar75;
            auVar49._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar31) * fVar76;
            auVar49._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar31) * fVar90;
            auVar49._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar31) * fVar86;
            auVar58._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar32) * fVar107;
            auVar58._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar32) * fVar108;
            auVar58._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar32) * fVar109;
            auVar58._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar32) * fVar110;
            pfVar2 = (float *)(uVar23 + 0x80 + uVar25);
            pfVar1 = (float *)(uVar23 + 0x20 + uVar25);
            auVar40._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar68) * fVar80;
            auVar40._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar74) * fVar81;
            auVar40._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar77) * fVar101;
            auVar40._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar79) * fVar102;
            auVar59 = maxps(auVar58,auVar40);
            auVar41._4_4_ = fVar88;
            auVar41._0_4_ = fVar87;
            auVar41._8_4_ = fVar94;
            auVar41._12_4_ = fVar67;
            auVar57 = maxps(auVar41,auVar49);
            pfVar2 = (float *)(uVar23 + 0x80 + (uVar27 ^ 0x10));
            pfVar1 = (float *)(uVar23 + 0x20 + (uVar27 ^ 0x10));
            _local_10e8 = maxps(auVar57,auVar59);
            auVar69._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar31) * fVar111;
            auVar69._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar31) * fVar112;
            auVar69._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar31) * fVar92;
            auVar69._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar31) * fVar93;
            pfVar3 = (float *)(uVar23 + 0x80 + (uVar26 ^ 0x10));
            pfVar1 = (float *)(uVar23 + 0x20 + (uVar26 ^ 0x10));
            pfVar4 = (float *)(uVar23 + 0x80 + (uVar25 ^ 0x10));
            pfVar2 = (float *)(uVar23 + 0x20 + (uVar25 ^ 0x10));
            auVar60._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar32) * fVar103;
            auVar60._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar32) * fVar104;
            auVar60._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar32) * fVar105;
            auVar60._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar32) * fVar106;
            auVar50._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar68) * fVar95;
            auVar50._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar74) * fVar98;
            auVar50._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar77) * fVar99;
            auVar50._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar79) * fVar100;
            auVar59 = minps(auVar60,auVar50);
            auVar51._4_4_ = fVar33;
            auVar51._0_4_ = fVar48;
            auVar51._8_4_ = fVar89;
            auVar51._12_4_ = fVar73;
            auVar57 = minps(auVar51,auVar69);
            auVar57 = minps(auVar57,auVar59);
            if (uVar21 == 6) {
              bVar11 = (fVar5 < *(float *)(uVar23 + 0xf0) && *(float *)(uVar23 + 0xe0) <= fVar5) &&
                       local_10e8._0_4_ <= auVar57._0_4_;
              bVar12 = (fVar5 < *(float *)(uVar23 + 0xf4) && *(float *)(uVar23 + 0xe4) <= fVar5) &&
                       local_10e8._4_4_ <= auVar57._4_4_;
              bVar13 = (fVar5 < *(float *)(uVar23 + 0xf8) && *(float *)(uVar23 + 0xe8) <= fVar5) &&
                       local_10e8._8_4_ <= auVar57._8_4_;
              bVar14 = (fVar5 < *(float *)(uVar23 + 0xfc) && *(float *)(uVar23 + 0xec) <= fVar5) &&
                       local_10e8._12_4_ <= auVar57._12_4_;
            }
            else {
              bVar11 = local_10e8._0_4_ <= auVar57._0_4_;
              bVar12 = local_10e8._4_4_ <= auVar57._4_4_;
              bVar13 = local_10e8._8_4_ <= auVar57._8_4_;
              bVar14 = local_10e8._12_4_ <= auVar57._12_4_;
            }
            auVar34._0_4_ = (uint)bVar11 * -0x80000000;
            auVar34._4_4_ = (uint)bVar12 * -0x80000000;
            auVar34._8_4_ = (uint)bVar13 * -0x80000000;
            auVar34._12_4_ = (uint)bVar14 * -0x80000000;
            uVar21 = movmskps((int)context,auVar34);
          }
          context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar21);
          if (context == (RayQueryContext *)0x0) goto LAB_00569a81;
          lVar10 = 0;
          if (context != (RayQueryContext *)0x0) {
            for (; ((ulong)context >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          uVar22 = *(ulong *)(uVar23 + lVar10 * 8);
          uVar21 = uVar21 - 1 & uVar21;
          if (uVar21 != 0) {
            uVar28 = *(uint *)(local_10e8 + lVar10 * 4);
            lVar10 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            uVar9 = *(ulong *)(uVar23 + lVar10 * 8);
            uVar29 = *(uint *)(local_10e8 + lVar10 * 4);
            uVar21 = uVar21 - 1 & uVar21;
            context = (RayQueryContext *)(ulong)uVar21;
            if (uVar21 == 0) {
              if (uVar28 < uVar29) {
                *(ulong *)*pauVar24 = uVar9;
                *(uint *)((long)*pauVar24 + 8) = uVar29;
                pauVar24 = pauVar24 + 1;
              }
              else {
                *(ulong *)*pauVar24 = uVar22;
                *(uint *)((long)*pauVar24 + 8) = uVar28;
                uVar22 = uVar9;
                pauVar24 = pauVar24 + 1;
              }
            }
            else {
              auVar37._8_4_ = uVar28;
              auVar37._0_8_ = uVar22;
              auVar37._12_4_ = 0;
              auVar46._8_4_ = uVar29;
              auVar46._0_8_ = uVar9;
              auVar46._12_4_ = 0;
              lVar10 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar21 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              uVar22 = *(ulong *)(uVar23 + lVar10 * 8);
              iVar7 = *(int *)(local_10e8 + lVar10 * 4);
              auVar55._8_4_ = iVar7;
              auVar55._0_8_ = uVar22;
              auVar55._12_4_ = 0;
              auVar63._8_4_ = -(uint)((int)uVar28 < (int)uVar29);
              uVar21 = uVar21 - 1 & uVar21;
              if (uVar21 == 0) {
                auVar63._4_4_ = auVar63._8_4_;
                auVar63._0_4_ = auVar63._8_4_;
                auVar63._12_4_ = auVar63._8_4_;
                auVar57 = auVar37 & auVar63 | ~auVar63 & auVar46;
                auVar59 = auVar46 & auVar63 | ~auVar63 & auVar37;
                auVar64._8_4_ = -(uint)(auVar57._8_4_ < iVar7);
                auVar64._0_8_ = CONCAT44(auVar64._8_4_,auVar64._8_4_);
                auVar64._12_4_ = auVar64._8_4_;
                uVar22 = ~auVar64._0_8_ & uVar22 | auVar57._0_8_ & auVar64._0_8_;
                auVar57 = auVar55 & auVar64 | ~auVar64 & auVar57;
                auVar38._8_4_ = -(uint)(auVar59._8_4_ < auVar57._8_4_);
                auVar38._4_4_ = auVar38._8_4_;
                auVar38._0_4_ = auVar38._8_4_;
                auVar38._12_4_ = auVar38._8_4_;
                *pauVar24 = ~auVar38 & auVar59 | auVar57 & auVar38;
                pauVar24[1] = auVar59 & auVar38 | ~auVar38 & auVar57;
                pauVar24 = pauVar24 + 2;
                fVar103 = local_10d8;
                fVar104 = fStack_10d4;
                fVar105 = fStack_10d0;
                fVar106 = fStack_10cc;
              }
              else {
                lVar10 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                  }
                }
                iVar8 = *(int *)(local_10e8 + lVar10 * 4);
                auVar71._8_4_ = iVar8;
                auVar71._0_8_ = *(undefined8 *)(uVar23 + lVar10 * 8);
                auVar71._12_4_ = 0;
                auVar65._4_4_ = auVar63._8_4_;
                auVar65._0_4_ = auVar63._8_4_;
                auVar65._8_4_ = auVar63._8_4_;
                auVar65._12_4_ = auVar63._8_4_;
                auVar57 = auVar37 & auVar65 | ~auVar65 & auVar46;
                auVar59 = auVar46 & auVar65 | ~auVar65 & auVar37;
                auVar84._0_4_ = -(uint)(iVar7 < iVar8);
                auVar84._4_4_ = -(uint)(iVar7 < iVar8);
                auVar84._8_4_ = -(uint)(iVar7 < iVar8);
                auVar84._12_4_ = -(uint)(iVar7 < iVar8);
                auVar66 = auVar55 & auVar84 | ~auVar84 & auVar71;
                auVar85 = ~auVar84 & auVar55 | auVar71 & auVar84;
                auVar56._8_4_ = -(uint)(auVar59._8_4_ < auVar85._8_4_);
                auVar56._4_4_ = auVar56._8_4_;
                auVar56._0_4_ = auVar56._8_4_;
                auVar56._12_4_ = auVar56._8_4_;
                auVar72 = auVar59 & auVar56 | ~auVar56 & auVar85;
                auVar47._8_4_ = -(uint)(auVar57._8_4_ < auVar66._8_4_);
                auVar47._0_8_ = CONCAT44(auVar47._8_4_,auVar47._8_4_);
                auVar47._12_4_ = auVar47._8_4_;
                uVar22 = auVar57._0_8_ & auVar47._0_8_ | ~auVar47._0_8_ & auVar66._0_8_;
                auVar57 = ~auVar47 & auVar57 | auVar66 & auVar47;
                auVar39._8_4_ = -(uint)(auVar57._8_4_ < auVar72._8_4_);
                auVar39._4_4_ = auVar39._8_4_;
                auVar39._0_4_ = auVar39._8_4_;
                auVar39._12_4_ = auVar39._8_4_;
                *pauVar24 = ~auVar56 & auVar59 | auVar85 & auVar56;
                pauVar24[1] = ~auVar39 & auVar57 | auVar72 & auVar39;
                pauVar24[2] = auVar57 & auVar39 | ~auVar39 & auVar72;
                pauVar24 = pauVar24 + 3;
                fVar103 = local_10d8;
                fVar104 = fStack_10d4;
                fVar105 = fStack_10d0;
                fVar106 = fStack_10cc;
                fVar107 = local_10a8;
                fVar108 = fStack_10a4;
                fVar109 = fStack_10a0;
                fVar110 = fStack_109c;
                fVar111 = local_10b8;
                fVar112 = fStack_10b4;
                fVar92 = fStack_10b0;
                fVar93 = fStack_10ac;
              }
            }
          }
        }
        (**(code **)((long)local_1078->leafIntersector +
                    (ulong)*(byte *)(uVar22 & 0xfffffffffffffff0) * 0x40))(local_fb8,ray,local_1070)
        ;
        fVar48 = (local_1080->super_RayK<1>).tfar;
        context = extraout_RDX;
        ray = local_1080;
        fVar33 = fVar48;
        fVar89 = fVar48;
        fVar73 = fVar48;
        fVar75 = local_1068;
        fVar76 = fStack_1064;
        fVar90 = fStack_1060;
        fVar86 = fStack_105c;
        fVar87 = local_1038;
        fVar88 = fStack_1034;
        fVar94 = fStack_1030;
        fVar67 = fStack_102c;
        fVar68 = local_10c8;
        fVar74 = fStack_10c4;
        fVar77 = fStack_10c0;
        fVar79 = fStack_10bc;
        fVar80 = local_1058;
        fVar81 = fStack_1054;
        fVar101 = fStack_1050;
        fVar102 = fStack_104c;
        fVar103 = local_10d8;
        fVar104 = fStack_10d4;
        fVar105 = fStack_10d0;
        fVar106 = fStack_10cc;
        fVar107 = local_10a8;
        fVar108 = fStack_10a4;
        fVar109 = fStack_10a0;
        fVar110 = fStack_109c;
        fVar111 = local_10b8;
        fVar112 = fStack_10b4;
        fVar92 = fStack_10b0;
        fVar93 = fStack_10ac;
        fVar95 = local_1048;
        fVar98 = fStack_1044;
        fVar99 = fStack_1040;
        fVar100 = fStack_103c;
      }
      goto LAB_00569a81;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }